

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Exp_PrintNodeVerilog(FILE *pFile,int nVars,Vec_Int_t *p,Vec_Ptr_t *vNames,int Node,int fCompl)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  
  if ((-1 < Node) && (uVar1 = Node * 2 + 1, (int)uVar1 < p->nSize)) {
    iVar2 = nVars * 2;
    if (SBORROW4(p->pArray[uVar1],iVar2) == p->pArray[uVar1] + nVars * -2 < 0) {
      fputc(0x28,(FILE *)pFile);
    }
    if ((int)uVar1 < p->nSize) {
      Exp_PrintLitVerilog(pFile,nVars,p,vNames,p->pArray[uVar1] ^ fCompl);
      if ((int)uVar1 < p->nSize) {
        uVar3 = Node * 2;
        if (iVar2 <= p->pArray[uVar1]) {
          fputc(0x29,(FILE *)pFile);
        }
        uVar4 = 0x7c;
        if (fCompl == 0) {
          uVar4 = 0x26;
        }
        fprintf((FILE *)pFile," %c ",uVar4);
        if ((int)uVar3 < p->nSize) {
          if (iVar2 <= p->pArray[uVar3]) {
            fputc(0x28,(FILE *)pFile);
          }
          if ((int)uVar3 < p->nSize) {
            Exp_PrintLitVerilog(pFile,nVars,p,vNames,fCompl ^ p->pArray[uVar3]);
            if ((int)uVar3 < p->nSize) {
              if (p->pArray[uVar3] < iVar2) {
                return;
              }
              fputc(0x29,(FILE *)pFile);
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Exp_PrintNodeVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Node, int fCompl )
{
    extern void Exp_PrintLitVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Lit );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+1) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, ")" );
    fprintf( pFile, " %c ", fCompl ? '|' : '&' );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+0) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, ")" );
}